

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

bool __thiscall dgMeshEffect::HasOpenEdges(dgMeshEffect *this)

{
  Iterator local_18;
  
  local_18.m_tree = (dgTree<dgEdge,_long> *)this;
  local_18.m_ptr = &dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this)->super_dgRedBackNode
  ;
  while (((dgTreeNode *)local_18.m_ptr != (dgTreeNode *)0x0 &&
         (-1 < ((dgEdge *)((long)local_18.m_ptr + 0x28))->m_incidentFace))) {
    dgTree<dgEdge,_long>::Iterator::operator++(&local_18,0);
  }
  return (dgTreeNode *)local_18.m_ptr != (dgTreeNode *)0x0;
}

Assistant:

bool dgMeshEffect::HasOpenEdges () const
{
	dgPolyhedra::Iterator iter (*this);
	for (iter.Begin(); iter; iter ++){
		dgEdge* const face = &(*iter);
		if (face->m_incidentFace < 0){
			return true;
		}
	}
	return false;
}